

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_sliver_layers(Omega_h *this,Mesh *mesh,Real qual_ceil,Int nlayers)

{
  Omega_h_Parting OVar1;
  void *extraout_RDX;
  Read<signed_char> RVar2;
  Bytes elems_are_slivers;
  Reals quals;
  Write<signed_char> local_60;
  Write<double> local_50;
  Write<signed_char> local_40;
  
  OVar1 = Mesh::parting(mesh);
  if (OVar1 == OMEGA_H_GHOSTED) {
    Mesh::ask_qualities((Mesh *)&stack0xffffffffffffffd0);
    Write<double>::Write(&local_50,(Write<double> *)&stack0xffffffffffffffd0);
    each_lt<double>((Omega_h *)&local_40,(Read<double> *)&local_50,qual_ceil);
    Write<double>::~Write(&local_50);
    Write<signed_char>::Write(&local_60,&local_40);
    mark_dual_layers(this,mesh,(Read<signed_char> *)&local_60,nlayers);
    Write<signed_char>::~Write(&local_60);
    Write<signed_char>::~Write(&local_40);
    Write<double>::~Write((Write<double> *)&stack0xffffffffffffffd0);
    RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar2.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,0xd0);
}

Assistant:

Read<I8> mark_sliver_layers(Mesh* mesh, Real qual_ceil, Int nlayers) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto quals = mesh->ask_qualities();
  auto elems_are_slivers = each_lt(quals, qual_ceil);
  return mark_dual_layers(mesh, elems_are_slivers, nlayers);
}